

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O0

void __thiscall wabt::BinaryReaderLogging::WriteIndent(BinaryReaderLogging *this)

{
  ulong local_18;
  size_t i;
  BinaryReaderLogging *this_local;
  
  for (local_18 = (ulong)this->indent_; 0x8e < local_18; local_18 = local_18 - 0x8e) {
    Stream::WriteData(this->stream_,WriteIndent::s_indent,0x8e,(char *)0x0,No);
  }
  if (local_18 != 0) {
    Stream::WriteData(this->stream_,WriteIndent::s_indent,(long)this->indent_,(char *)0x0,No);
  }
  return;
}

Assistant:

void BinaryReaderLogging::WriteIndent() {
  static char s_indent[] =
      "                                                                       "
      "                                                                       ";
  static const size_t s_indent_len = sizeof(s_indent) - 1;
  size_t i = indent_;
  while (i > s_indent_len) {
    stream_->WriteData(s_indent, s_indent_len);
    i -= s_indent_len;
  }
  if (i > 0) {
    stream_->WriteData(s_indent, indent_);
  }
}